

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

Ptr __thiscall
TgBot::Api::sendGame
          (Api *this,int64_t chatId,string *gameShortName,int32_t replyToMessageId,Ptr *replyMarkup,
          bool disableNotification)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000089;
  Ptr PVar2;
  byte in_stack_00000008;
  allocator local_e1;
  string local_e0;
  ptree local_c0;
  shared_ptr<TgBot::GenericReply> local_98;
  string local_88;
  undefined1 local_58 [8];
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  bool disableNotification_local;
  Ptr *replyMarkup_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_28;
  int32_t replyToMessageId_local;
  string *gameShortName_local;
  int64_t chatId_local;
  Api *this_local;
  
  replyMarkup_local._4_4_ = (int)replyMarkup;
  pbStack_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_0000000c,replyToMessageId);
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = in_stack_00000008 & 1;
  gameShortName_local = gameShortName;
  chatId_local = chatId;
  this_local = this;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_58);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_58,5);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_58,
             (char (*) [8])0x4758d6,(long *)&gameShortName_local);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[16],std::__cxx11::string_const&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_58,
             (char (*) [16])"game_short_name",pbStack_28);
  if (replyMarkup_local._4_4_ != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[20],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_58,
               (char (*) [20])"reply_to_message_id",(int *)((long)&replyMarkup_local + 4));
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)CONCAT71(in_register_00000089,disableNotification));
  if (bVar1) {
    std::shared_ptr<TgBot::GenericReply>::shared_ptr<TgBot::InlineKeyboardMarkup,void>
              (&local_98,
               (shared_ptr<TgBot::InlineKeyboardMarkup> *)
               CONCAT71(in_register_00000089,disableNotification));
    TgTypeParser::parseGenericReply_abi_cxx11_(&local_88,(TgTypeParser *)(chatId + 0x28),&local_98);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[13],std::__cxx11::string>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_58,
               (char (*) [13])"reply_markup",&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::shared_ptr<TgBot::GenericReply>::~shared_ptr(&local_98);
  }
  if ((args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[21],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_58,
               (char (*) [21])"disable_notification",
               (bool *)((long)&args.
                               super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"sendGame",&local_e1);
  sendRequest(&local_c0,(Api *)chatId,&local_e0,
              (vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_58);
  TgTypeParser::parseJsonAndGetMessage((TgTypeParser *)this,(ptree *)(chatId + 0x28));
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_58);
  PVar2.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ptr)PVar2.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Message::Ptr Api::sendGame(int64_t chatId, const std::string& gameShortName, int32_t replyToMessageId, const InlineKeyboardMarkup::Ptr replyMarkup, bool disableNotification) const {
    vector<HttpReqArg> args;
    args.reserve(5);
    args.emplace_back("chat_id", chatId);
    args.emplace_back("game_short_name", gameShortName);
    if (replyToMessageId) {
        args.emplace_back("reply_to_message_id", replyToMessageId);
    }
    if (replyMarkup) {
        args.emplace_back("reply_markup", _tgTypeParser.parseGenericReply(replyMarkup));
    }
    if (disableNotification){
        args.emplace_back("disable_notification", disableNotification);
    }
    return _tgTypeParser.parseJsonAndGetMessage(sendRequest("sendGame", args));
}